

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<char,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  size_t sVar1;
  uint uVar2;
  undefined4 *puVar3;
  internal_node<char,_false> *piVar4;
  ulong uVar5;
  ulong uVar6;
  char *__function;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_88;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_80;
  uint32_t local_78;
  uint local_74;
  undefined4 *local_70;
  ref<immutable::rrb_details::internal_node<char,_false>_> *local_68;
  ulong local_60;
  internal_node<char,_false> *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  internal_node<char,_false> *local_38;
  
  local_50 = (ulong)slen;
  sVar1 = local_50 * 8;
  local_68 = all;
  local_48 = node_size;
  puVar3 = (undefined4 *)malloc(local_50 * 8 + 0x20);
  puVar3[1] = slen;
  *puVar3 = 1;
  *(undefined8 *)(puVar3 + 4) = 0;
  puVar3[3] = 0;
  *(undefined4 **)(puVar3 + 6) = puVar3 + 8;
  memset(puVar3 + 8,0,sVar1);
  *(undefined4 **)this = puVar3;
  puVar3[2] = 1;
  local_70 = puVar3;
  local_58 = (internal_node<char,_false> *)this;
  if (shift == 6) {
    if (slen != 0) {
      uVar10 = 0;
      uVar11 = 0;
      uVar12 = 0;
      local_78 = 6;
      do {
        if (local_68->ptr == (internal_node<char,_false> *)0x0) {
LAB_0014fa7d:
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
          ;
LAB_0014faa9:
          __assert_fail("ptr != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                        ,0x71a,__function);
        }
        uVar8 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        uVar13 = (ulong)uVar8;
        local_80.ptr = local_68->ptr->child[uVar11].ptr;
        if (local_80.ptr == (internal_node<char,_false> *)0x0) {
          if (uVar12 == 0) {
LAB_0014fa94:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
            ;
            goto LAB_0014faa9;
          }
LAB_0014f681:
          local_88.ptr = (internal_node<char,_false> *)malloc(uVar13 + 0x18);
          (local_88.ptr)->len = uVar8;
          (local_88.ptr)->type = LEAF_NODE;
          ((local_88.ptr)->size_table).ptr = (rrb_size_table<false> *)&(local_88.ptr)->child;
          (local_88.ptr)->guid = 0;
          if (uVar8 == 0) {
            (local_88.ptr)->_ref_count = 1;
          }
          else {
            uVar5 = 0;
            do {
              *(undefined1 *)((long)&(((local_88.ptr)->size_table).ptr)->size + uVar5) = 0;
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
            (local_88.ptr)->_ref_count = 1;
            if (uVar8 != 0) {
              uVar5 = 0;
              do {
                if (local_68->ptr == (internal_node<char,_false> *)0x0) goto LAB_0014fa7d;
                piVar4 = local_68->ptr->child[uVar11].ptr;
                if (piVar4 == (internal_node<char,_false> *)0x0) goto LAB_0014fa94;
                piVar4->_ref_count = piVar4->_ref_count + 1;
                uVar7 = (uint)uVar5;
                uVar2 = uVar8 - uVar7;
                if (uVar2 < piVar4->len - uVar12) {
                  if (uVar8 != uVar7) {
                    uVar6 = (ulong)uVar2;
                    uVar7 = uVar12;
                    do {
                      if (local_88.ptr == (internal_node<char,_false> *)0x0) goto LAB_0014fa94;
                      *(undefined1 *)((long)&(((local_88.ptr)->size_table).ptr)->size + uVar5) =
                           *(undefined1 *)((long)&((piVar4->size_table).ptr)->size + (ulong)uVar7);
                      uVar5 = (ulong)((int)uVar5 + 1);
                      uVar7 = uVar7 + 1;
                      uVar6 = uVar6 - 1;
                    } while (uVar6 != 0);
                  }
                  uVar12 = uVar12 + uVar2;
                  uVar5 = uVar13;
                }
                else {
                  uVar2 = 0;
                  if (piVar4->len != uVar12) {
                    uVar5 = 0;
                    do {
                      if (local_88.ptr == (internal_node<char,_false> *)0x0) goto LAB_0014fa94;
                      *(undefined1 *)
                       ((long)&(((local_88.ptr)->size_table).ptr)->size +
                       (ulong)(uVar7 + (int)uVar5)) =
                           *(undefined1 *)
                            ((long)&((piVar4->size_table).ptr)->size + (ulong)(uVar12 + (int)uVar5))
                      ;
                      uVar5 = uVar5 + 1;
                      uVar2 = piVar4->len - uVar12;
                    } while (uVar5 < uVar2);
                  }
                  uVar11 = (ulong)((int)uVar11 + 1);
                  uVar12 = 0;
                  uVar5 = (ulong)(uVar2 + uVar7);
                }
                uVar9 = piVar4->_ref_count;
                piVar4->_ref_count = uVar9 - 1;
                if (uVar9 == 1) {
                  free(piVar4);
                }
              } while ((uint)uVar5 < uVar8);
            }
          }
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)
                     (uVar10 * 8 + *(long *)(local_70 + 6)),
                     (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_88);
          if ((local_88.ptr != (internal_node<char,_false> *)0x0) &&
             (uVar9 = (local_88.ptr)->_ref_count, (local_88.ptr)->_ref_count = uVar9 - 1, uVar9 == 1
             )) {
            free(local_88.ptr);
          }
        }
        else {
          (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
          if ((uVar12 != 0) || (uVar8 != (local_80.ptr)->len)) goto LAB_0014f681;
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)
                     (uVar10 * 8 + *(long *)(local_70 + 6)),
                     (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_80);
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar12 = 0;
        }
        if ((local_80.ptr != (internal_node<char,_false> *)0x0) &&
           (uVar9 = (local_80.ptr)->_ref_count, (local_80.ptr)->_ref_count = uVar9 - 1, uVar9 == 1))
        {
          free(local_80.ptr);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_50);
    }
  }
  else if (slen != 0) {
    local_78 = shift - 6;
    uVar10 = 0;
    uVar12 = 0;
    uVar11 = 0;
    do {
      if (local_68->ptr == (internal_node<char,_false> *)0x0) goto LAB_0014fa7d;
      uVar8 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      local_60 = (ulong)uVar8;
      local_80.ptr = local_68->ptr->child[uVar12].ptr;
      if (local_80.ptr == (internal_node<char,_false> *)0x0) {
        if ((int)uVar11 == 0) goto LAB_0014fa7d;
LAB_0014f8ae:
        sVar1 = local_60 * 8;
        local_40 = uVar10;
        piVar4 = (internal_node<char,_false> *)malloc(local_60 * 8 + 0x20);
        piVar4->len = uVar8;
        piVar4->type = INTERNAL_NODE;
        (piVar4->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar4->guid = 0;
        piVar4->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar4 + 1);
        uVar10 = 0;
        memset(piVar4 + 1,0,sVar1);
        piVar4->_ref_count = 1;
        local_88.ptr = piVar4;
        while( true ) {
          uVar2 = (uint)uVar10;
          uVar8 = (uint)local_60 - uVar2;
          if ((uint)local_60 < uVar2 || uVar8 == 0) break;
          if ((local_68->ptr == (internal_node<char,_false> *)0x0) ||
             (piVar4 = local_68->ptr->child[uVar12].ptr, piVar4 == (internal_node<char,_false> *)0x0
             )) goto LAB_0014fa7d;
          piVar4->_ref_count = piVar4->_ref_count + 1;
          uVar9 = (uint32_t)uVar11;
          local_74 = uVar12;
          if (uVar8 < piVar4->len - uVar9) {
            uVar13 = (ulong)uVar8;
            do {
              if (local_88.ptr == (internal_node<char,_false> *)0x0) goto LAB_0014fa7d;
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        ((local_88.ptr)->child + uVar10,piVar4->child + uVar11);
              uVar10 = (ulong)((int)uVar10 + 1);
              uVar11 = (ulong)((int)uVar11 + 1);
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
            uVar11 = (ulong)(uVar8 + uVar9);
            uVar10 = local_60 & 0xffffffff;
            uVar12 = local_74;
          }
          else {
            uVar8 = 0;
            if (piVar4->len != uVar9) {
              uVar10 = 0;
              do {
                if (local_88.ptr == (internal_node<char,_false> *)0x0) goto LAB_0014fa7d;
                ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                          ((local_88.ptr)->child + (uVar2 + (int)uVar10),
                           piVar4->child + ((int)uVar10 + uVar9));
                uVar10 = uVar10 + 1;
                uVar8 = piVar4->len - uVar9;
              } while (uVar10 < uVar8);
            }
            uVar12 = local_74 + 1;
            uVar10 = (ulong)(uVar8 + uVar2);
            uVar11 = 0;
          }
          release<char>(piVar4);
        }
        set_sizes<char,false,6>((rrb_details *)&local_38,&local_88,local_78);
        uVar10 = local_40;
        release<char>(local_38);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   (uVar10 * 8 + *(long *)(local_70 + 6)),&local_88);
        release<char>(local_88.ptr);
      }
      else {
        (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
        if (((int)uVar11 != 0) || (uVar8 != (local_80.ptr)->len)) goto LAB_0014f8ae;
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   (uVar10 * 8 + *(long *)(local_70 + 6)),&local_80);
        uVar12 = uVar12 + 1;
        uVar11 = 0;
      }
      release<char>(local_80.ptr);
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_50);
  }
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)local_58;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }